

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O1

void __thiscall
ThreadPool<std::packaged_task<void_()>_>::ThreadPool
          (ThreadPool<std::packaged_task<void_()>_> *this,size_t threads_number,size_t queue_size)

{
  thread local_50;
  _Bind<void_(ThreadPool<std::packaged_task<void_()>_>::*(ThreadPool<std::packaged_task<void_()>_>_*))()>
  local_48;
  
  NotLockFreeQueue<std::packaged_task<void_()>_>::NotLockFreeQueue(&this->queue,queue_size);
  (this->is_working)._M_base._M_i = true;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (threads_number != 0) {
    do {
      local_48._M_f = (offset_in_ThreadPool<std::packaged_task<void_()>_>_to_subr)execute;
      local_48._8_8_ = 0;
      local_48._M_bound_args.super__Tuple_impl<0UL,_ThreadPool<std::packaged_task<void_()>_>_*>.
      super__Head_base<0UL,_ThreadPool<std::packaged_task<void_()>_>_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_ThreadPool<std::packaged_task<void_()>_>_*>)
           (_Tuple_impl<0UL,_ThreadPool<std::packaged_task<void_()>_>_*>)this;
      std::thread::
      thread<std::_Bind<void(ThreadPool<std::packaged_task<void()>>::*(ThreadPool<std::packaged_task<void()>>*))()>,,void>
                (&local_50,&local_48);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->threads,&local_50);
      if (local_50._M_id._M_thread != 0) {
        std::terminate();
      }
      threads_number = threads_number - 1;
    } while (threads_number != 0);
  }
  return;
}

Assistant:

ThreadPool<T>::ThreadPool(size_t threads_number, size_t queue_size) : 
            queue(queue_size), is_working(true) {
    for (size_t i = 0; i < threads_number; i++) {
        threads.push_back(std::thread(std::bind(&ThreadPool::execute, this)));
    }
}